

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char sqlite3ExprAffinity(Expr *pExpr)

{
  byte bVar1;
  char cVar2;
  Expr *pEVar3;
  ExprList *pEVar4;
  
  do {
    pEVar3 = sqlite3ExprSkipCollate(pExpr);
    if ((pEVar3->flags & 0x200) != 0) {
      return '\0';
    }
    bVar1 = pEVar3->op;
    if (bVar1 == 0x9d) {
      bVar1 = pEVar3->op2;
LAB_0015753f:
      if (bVar1 == 0x25) {
        cVar2 = sqlite3AffinityType((pEVar3->u).zToken,(u8 *)0x0);
        return cVar2;
      }
      if ((bVar1 & 0xfd) == 0x98) {
        if (pEVar3->pTab != (Table *)0x0) {
          if (-1 < (long)pEVar3->iColumn) {
            return pEVar3->pTab->aCol[pEVar3->iColumn].affinity;
          }
          return 'D';
        }
LAB_001575a4:
        return pEVar3->affinity;
      }
      if (bVar1 != 0x9f) goto LAB_001575a4;
      pEVar4 = (ExprList *)
               &((pEVar3->pLeft->x).pSelect)->pEList->a[(long)pEVar3->iColumn + -1].sortOrder;
    }
    else {
      if (bVar1 != 0x77) goto LAB_0015753f;
      pEVar4 = ((pEVar3->x).pSelect)->pEList;
    }
    pExpr = pEVar4->a[0].pExpr;
  } while( true );
}

Assistant:

SQLITE_PRIVATE char sqlite3ExprAffinity(Expr *pExpr){
  int op;
  pExpr = sqlite3ExprSkipCollate(pExpr);
  if( pExpr->flags & EP_Generic ) return 0;
  op = pExpr->op;
  if( op==TK_SELECT ){
    assert( pExpr->flags&EP_xIsSelect );
    return sqlite3ExprAffinity(pExpr->x.pSelect->pEList->a[0].pExpr);
  }
  if( op==TK_REGISTER ) op = pExpr->op2;
#ifndef SQLITE_OMIT_CAST
  if( op==TK_CAST ){
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    return sqlite3AffinityType(pExpr->u.zToken, 0);
  }
#endif
  if( (op==TK_AGG_COLUMN || op==TK_COLUMN) && pExpr->pTab ){
    return sqlite3TableColumnAffinity(pExpr->pTab, pExpr->iColumn);
  }
  if( op==TK_SELECT_COLUMN ){
    assert( pExpr->pLeft->flags&EP_xIsSelect );
    return sqlite3ExprAffinity(
        pExpr->pLeft->x.pSelect->pEList->a[pExpr->iColumn].pExpr
    );
  }
  return pExpr->affinity;
}